

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

bool __thiscall
soplex::SPxLPBase<double>::readFile
          (SPxLPBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  ifstream *in_RDI;
  undefined8 in_R8;
  spxifstream file;
  size_t in_stack_fffffffffffffc88;
  string local_370 [4];
  openmode in_stack_fffffffffffffc94;
  string *in_stack_fffffffffffffc98;
  ifstream *in_stack_fffffffffffffca0;
  long local_350 [100];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,in_RSI,(allocator *)&stack0xfffffffffffffc8f);
  zstr::ifstream::ifstream
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc8f);
  bVar1 = std::ios::operator!((void *)((long)local_350 + *(long *)(local_350[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    iVar2 = (*(in_RDI->super_istream)._vptr_basic_istream[0x1e])
                      (in_RDI,local_350,local_20,local_28,local_30);
    local_1 = (byte)iVar2 & 1;
  }
  else {
    local_1 = 0;
  }
  zstr::ifstream::~ifstream(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool readFile(const char* filename, NameSet* rowNames = nullptr,
                         NameSet* colNames = nullptr,
                         DIdxSet* intVars = nullptr)
   {

      spxifstream file(filename);

      if(!file)
         return false;

      return read(file, rowNames, colNames, intVars);
   }